

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::IFCImporter::CanRead(IFCImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  char *pcStack_70;
  bool found;
  char *tokens [1];
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string *extension;
  IOSystem *pIStack_28;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  IFCImporter *this_local;
  
  extension._7_1_ = checkSig;
  pIStack_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)pFile;
  pFile_local = (string *)this;
  BaseImporter::GetExtension(&local_58,pFile);
  local_38 = &local_58;
  bVar1 = std::operator==(&local_58,"ifc");
  if (!bVar1) {
    bVar1 = std::operator==(local_38,"ifczip");
    if (!bVar1) {
      lVar2 = std::__cxx11::string::length();
      if (((lVar2 == 0) || ((extension._7_1_ & 1) != 0)) && (pIStack_28 != (IOSystem *)0x0)) {
        pcStack_70 = "ISO-10303-21";
        this_local._7_1_ =
             BaseImporter::SearchFileHeaderForToken
                       (pIStack_28,(string *)pIOHandler_local,&stack0xffffffffffffff90,1,200,false,
                        false);
      }
      else {
        this_local._7_1_ = false;
      }
      goto LAB_007a5727;
    }
  }
  this_local._7_1_ = true;
LAB_007a5727:
  tokens[0]._0_4_ = 1;
  std::__cxx11::string::~string((string *)&local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool IFCImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == "ifc" || extension == "ifczip" ) {
        return true;
    } else if ((!extension.length() || checkSig) && pIOHandler)   {
        // note: this is the common identification for STEP-encoded files, so
        // it is only unambiguous as long as we don't support any further
        // file formats with STEP as their encoding.
        const char* tokens[] = {"ISO-10303-21"};
        const bool found( SearchFileHeaderForToken( pIOHandler, pFile, tokens, 1 ) );
        return found;
    }
    return false;
}